

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_BlastMultiplier3(Gia_Man_t *pNew,int *pArgA,int *pArgB,int nArgA,int nArgB,Vec_Int_t *vRes)

{
  int iVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  Vec_Wec_t *vProds;
  Vec_Int_t *pVVar5;
  Vec_Wec_t *vLevels;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong local_80;
  long local_68;
  
  iVar6 = nArgB + nArgA;
  vProds = (Vec_Wec_t *)malloc(0x10);
  iVar4 = 8;
  if (6 < (nArgB + nArgA) - 1U) {
    iVar4 = iVar6;
  }
  vProds->nSize = 0;
  vProds->nCap = iVar4;
  if (iVar4 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)iVar4,0x10);
  }
  vProds->pArray = pVVar5;
  vProds->nSize = iVar6;
  vLevels = (Vec_Wec_t *)malloc(0x10);
  vLevels->nSize = 0;
  vLevels->nCap = iVar4;
  if (iVar4 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)iVar4,0x10);
  }
  vLevels->pArray = pVVar5;
  vLevels->nSize = iVar6;
  if (0 < nArgA) {
    local_68 = 0;
    local_80 = 0;
    do {
      if (0 < nArgB) {
        uVar7 = 0;
        uVar8 = local_80;
        lVar10 = local_68;
        do {
          iVar4 = Gia_ManHashAnd(pNew,pArgA[local_80],pArgB[uVar7]);
          iVar6 = (int)uVar8;
          if (vProds->nSize <= iVar6) {
            uVar3 = vProds->nSize * 2;
            uVar9 = iVar6 + 1;
            if ((int)uVar3 <= (int)uVar9) {
              uVar3 = uVar9;
            }
            iVar1 = vProds->nCap;
            if (iVar1 < (int)uVar3) {
              if (vProds->pArray == (Vec_Int_t *)0x0) {
                pVVar5 = (Vec_Int_t *)malloc((ulong)uVar3 << 4);
              }
              else {
                pVVar5 = (Vec_Int_t *)realloc(vProds->pArray,(ulong)uVar3 << 4);
              }
              vProds->pArray = pVVar5;
              memset(pVVar5 + iVar1,0,(long)(int)(uVar3 - iVar1) << 4);
              vProds->nCap = uVar3;
            }
            vProds->nSize = uVar9;
          }
          if (vProds->nSize <= iVar6) {
LAB_00306059:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                          ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          Vec_IntPush((Vec_Int_t *)((long)&vProds->pArray->nCap + lVar10),iVar4);
          if (vLevels->nSize <= iVar6) {
            uVar3 = vLevels->nSize * 2;
            uVar9 = iVar6 + 1;
            if ((int)uVar3 <= (int)uVar9) {
              uVar3 = uVar9;
            }
            iVar4 = vLevels->nCap;
            if (iVar4 < (int)uVar3) {
              if (vLevels->pArray == (Vec_Int_t *)0x0) {
                pVVar5 = (Vec_Int_t *)malloc((ulong)uVar3 << 4);
              }
              else {
                pVVar5 = (Vec_Int_t *)realloc(vLevels->pArray,(ulong)uVar3 << 4);
              }
              vLevels->pArray = pVVar5;
              memset(pVVar5 + iVar4,0,(long)(int)(uVar3 - iVar4) << 4);
              vLevels->nCap = uVar3;
            }
            vLevels->nSize = uVar9;
          }
          if (vLevels->nSize <= iVar6) goto LAB_00306059;
          Vec_IntPush((Vec_Int_t *)((long)&vLevels->pArray->nCap + lVar10),0);
          uVar7 = uVar7 + 1;
          uVar8 = (ulong)(iVar6 + 1);
          lVar10 = lVar10 + 0x10;
        } while ((uint)nArgB != uVar7);
      }
      local_80 = local_80 + 1;
      local_68 = local_68 + 0x10;
    } while (local_80 != (uint)nArgA);
  }
  Wlc_BlastReduceMatrix(pNew,vProds,vLevels,vRes);
  iVar4 = vProds->nCap;
  if (0 < (long)iVar4) {
    pVVar5 = vProds->pArray;
    lVar10 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar5->pArray + lVar10);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)&pVVar5->pArray + lVar10) = 0;
      }
      lVar10 = lVar10 + 0x10;
    } while ((long)iVar4 * 0x10 != lVar10);
  }
  if (vProds->pArray != (Vec_Int_t *)0x0) {
    free(vProds->pArray);
    vProds->pArray = (Vec_Int_t *)0x0;
  }
  vProds->nCap = 0;
  vProds->nSize = 0;
  free(vProds);
  iVar4 = vLevels->nCap;
  if (0 < (long)iVar4) {
    pVVar5 = vLevels->pArray;
    lVar10 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar5->pArray + lVar10);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)&pVVar5->pArray + lVar10) = 0;
      }
      lVar10 = lVar10 + 0x10;
    } while ((long)iVar4 * 0x10 != lVar10);
  }
  if (vLevels->pArray != (Vec_Int_t *)0x0) {
    free(vLevels->pArray);
    vLevels->pArray = (Vec_Int_t *)0x0;
  }
  vLevels->nCap = 0;
  vLevels->nSize = 0;
  free(vLevels);
  return;
}

Assistant:

void Wlc_BlastMultiplier3( Gia_Man_t * pNew, int * pArgA, int * pArgB, int nArgA, int nArgB, Vec_Int_t * vRes )
{
    Vec_Wec_t * vProds  = Vec_WecStart( nArgA + nArgB );
    Vec_Wec_t * vLevels = Vec_WecStart( nArgA + nArgB );
    int i, k;
    for ( i = 0; i < nArgA; i++ )
        for ( k = 0; k < nArgB; k++ )
        {
            Vec_WecPush( vProds,  i+k, Gia_ManHashAnd(pNew, pArgA[i], pArgB[k]) );
            Vec_WecPush( vLevels, i+k, 0 );
        }

    Wlc_BlastReduceMatrix( pNew, vProds, vLevels, vRes );

    Vec_WecFree( vProds );
    Vec_WecFree( vLevels );
}